

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 ZSTD_finalizeOffBase(U32 rawOffset,U32 *rep,U32 ll0)

{
  int iVar1;
  U32 UVar2;
  
  if (rawOffset == 0) {
    __assert_fail("(rawOffset)>0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x69a3,"U32 ZSTD_finalizeOffBase(U32, const U32 *, U32)");
  }
  if ((ll0 == 0) && (*rep == rawOffset)) {
    return 1;
  }
  if (rep[1] == rawOffset) {
    iVar1 = 2;
  }
  else {
    if (rep[2] != rawOffset) {
      UVar2 = rawOffset + 3;
      if (ll0 != 0) {
        if (*rep - 1 == rawOffset) {
          UVar2 = 3;
        }
      }
      return UVar2;
    }
    iVar1 = 3;
  }
  return iVar1 - ll0;
}

Assistant:

static U32 ZSTD_finalizeOffBase(U32 rawOffset, const U32 rep[ZSTD_REP_NUM], U32 ll0)
{
    U32 offBase = OFFSET_TO_OFFBASE(rawOffset);

    if (!ll0 && rawOffset == rep[0]) {
        offBase = REPCODE1_TO_OFFBASE;
    } else if (rawOffset == rep[1]) {
        offBase = REPCODE_TO_OFFBASE(2 - ll0);
    } else if (rawOffset == rep[2]) {
        offBase = REPCODE_TO_OFFBASE(3 - ll0);
    } else if (ll0 && rawOffset == rep[0] - 1) {
        offBase = REPCODE3_TO_OFFBASE;
    }
    return offBase;
}